

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void getPixelColorRGBA8(uchar *r,uchar *g,uchar *b,uchar *a,uchar *in,size_t i,
                       LodePNGColorMode *mode)

{
  uchar uVar1;
  uint uVar2;
  size_t local_58;
  size_t j_1;
  uint index;
  uint value;
  size_t j;
  size_t sStack_38;
  uint highest;
  size_t i_local;
  uchar *in_local;
  uchar *a_local;
  uchar *b_local;
  uchar *g_local;
  uchar *r_local;
  
  sStack_38 = i;
  i_local = (size_t)in;
  in_local = a;
  a_local = b;
  b_local = g;
  g_local = r;
  if (mode->colortype == LCT_GREY) {
    if (mode->bitdepth == 8) {
      uVar1 = in[i];
      *b = uVar1;
      *g = uVar1;
      *r = uVar1;
      if ((mode->key_defined == 0) || ((uint)*r != mode->key_r)) {
        *a = 0xff;
      }
      else {
        *a = '\0';
      }
    }
    else if (mode->bitdepth == 0x10) {
      uVar1 = in[i * 2];
      *b = uVar1;
      *g = uVar1;
      *r = uVar1;
      if ((mode->key_defined == 0) || ((uint)in[i * 2] * 0x100 + (uint)in[i * 2 + 1] != mode->key_r)
         ) {
        *a = 0xff;
      }
      else {
        *a = '\0';
      }
    }
    else {
      j._4_4_ = (1 << ((byte)mode->bitdepth & 0x1f)) - 1;
      _index = i * mode->bitdepth;
      uVar2 = readBitsFromReversedStream((size_t *)&index,in,(ulong)mode->bitdepth);
      uVar1 = (uchar)((uVar2 * 0xff) / j._4_4_);
      *a_local = uVar1;
      *b_local = uVar1;
      *g_local = uVar1;
      if ((mode->key_defined == 0) || (uVar2 != mode->key_r)) {
        *in_local = 0xff;
      }
      else {
        *in_local = '\0';
      }
    }
  }
  else if (mode->colortype == LCT_RGB) {
    if (mode->bitdepth == 8) {
      *r = in[i * 3];
      *g = in[i * 3 + 1];
      *b = in[i * 3 + 2];
      if (((mode->key_defined == 0) || ((uint)*r != mode->key_r)) ||
         (((uint)*g != mode->key_g || ((uint)*b != mode->key_b)))) {
        *a = 0xff;
      }
      else {
        *a = '\0';
      }
    }
    else {
      *r = in[i * 6];
      *g = in[i * 6 + 2];
      *b = in[i * 6 + 4];
      if ((((mode->key_defined == 0) ||
           ((uint)in[i * 6] * 0x100 + (uint)in[i * 6 + 1] != mode->key_r)) ||
          ((uint)in[i * 6 + 2] * 0x100 + (uint)in[i * 6 + 3] != mode->key_g)) ||
         ((uint)in[i * 6 + 4] * 0x100 + (uint)in[i * 6 + 5] != mode->key_b)) {
        *a = 0xff;
      }
      else {
        *a = '\0';
      }
    }
  }
  else if (mode->colortype == LCT_PALETTE) {
    if (mode->bitdepth == 8) {
      j_1._0_4_ = (uint)in[i];
    }
    else {
      local_58 = i * mode->bitdepth;
      j_1._0_4_ = readBitsFromReversedStream(&local_58,in,(ulong)mode->bitdepth);
    }
    *g_local = mode->palette[(uint)j_1 << 2];
    *b_local = mode->palette[(uint)j_1 * 4 + 1];
    *a_local = mode->palette[(uint)j_1 * 4 + 2];
    *in_local = mode->palette[(uint)j_1 * 4 + 3];
  }
  else if (mode->colortype == LCT_GREY_ALPHA) {
    if (mode->bitdepth == 8) {
      uVar1 = in[i * 2];
      *b = uVar1;
      *g = uVar1;
      *r = uVar1;
      *a = in[i * 2 + 1];
    }
    else {
      uVar1 = in[i * 4];
      *b = uVar1;
      *g = uVar1;
      *r = uVar1;
      *a = in[i * 4 + 2];
    }
  }
  else if (mode->colortype == LCT_RGBA) {
    if (mode->bitdepth == 8) {
      *r = in[i * 4];
      *g = in[i * 4 + 1];
      *b = in[i * 4 + 2];
      *a = in[i * 4 + 3];
    }
    else {
      *r = in[i * 8];
      *g = in[i * 8 + 2];
      *b = in[i * 8 + 4];
      *a = in[i * 8 + 6];
    }
  }
  return;
}

Assistant:

static void getPixelColorRGBA8(unsigned char* r, unsigned char* g,
                               unsigned char* b, unsigned char* a,
                               const unsigned char* in, size_t i,
                               const LodePNGColorMode* mode) {
  if(mode->colortype == LCT_GREY) {
    if(mode->bitdepth == 8) {
      *r = *g = *b = in[i];
      if(mode->key_defined && *r == mode->key_r) *a = 0;
      else *a = 255;
    } else if(mode->bitdepth == 16) {
      *r = *g = *b = in[i * 2 + 0];
      if(mode->key_defined && 256U * in[i * 2 + 0] + in[i * 2 + 1] == mode->key_r) *a = 0;
      else *a = 255;
    } else {
      unsigned highest = ((1U << mode->bitdepth) - 1U); /*highest possible value for this bit depth*/
      size_t j = i * mode->bitdepth;
      unsigned value = readBitsFromReversedStream(&j, in, mode->bitdepth);
      *r = *g = *b = (value * 255) / highest;
      if(mode->key_defined && value == mode->key_r) *a = 0;
      else *a = 255;
    }
  } else if(mode->colortype == LCT_RGB) {
    if(mode->bitdepth == 8) {
      *r = in[i * 3 + 0]; *g = in[i * 3 + 1]; *b = in[i * 3 + 2];
      if(mode->key_defined && *r == mode->key_r && *g == mode->key_g && *b == mode->key_b) *a = 0;
      else *a = 255;
    } else {
      *r = in[i * 6 + 0];
      *g = in[i * 6 + 2];
      *b = in[i * 6 + 4];
      if(mode->key_defined && 256U * in[i * 6 + 0] + in[i * 6 + 1] == mode->key_r
         && 256U * in[i * 6 + 2] + in[i * 6 + 3] == mode->key_g
         && 256U * in[i * 6 + 4] + in[i * 6 + 5] == mode->key_b) *a = 0;
      else *a = 255;
    }
  } else if(mode->colortype == LCT_PALETTE) {
    unsigned index;
    if(mode->bitdepth == 8) index = in[i];
    else {
      size_t j = i * mode->bitdepth;
      index = readBitsFromReversedStream(&j, in, mode->bitdepth);
    }
    /*out of bounds of palette not checked: see lodepng_color_mode_alloc_palette.*/
    *r = mode->palette[index * 4 + 0];
    *g = mode->palette[index * 4 + 1];
    *b = mode->palette[index * 4 + 2];
    *a = mode->palette[index * 4 + 3];
  } else if(mode->colortype == LCT_GREY_ALPHA) {
    if(mode->bitdepth == 8) {
      *r = *g = *b = in[i * 2 + 0];
      *a = in[i * 2 + 1];
    } else {
      *r = *g = *b = in[i * 4 + 0];
      *a = in[i * 4 + 2];
    }
  } else if(mode->colortype == LCT_RGBA) {
    if(mode->bitdepth == 8) {
      *r = in[i * 4 + 0];
      *g = in[i * 4 + 1];
      *b = in[i * 4 + 2];
      *a = in[i * 4 + 3];
    } else {
      *r = in[i * 8 + 0];
      *g = in[i * 8 + 2];
      *b = in[i * 8 + 4];
      *a = in[i * 8 + 6];
    }
  }
}